

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

CURLcode Curl_pp_statemach(pingpong *pp,_Bool block)

{
  connectdata *conn_00;
  Curl_easy *data_00;
  _Bool _Var1;
  int iVar2;
  time_t tVar3;
  curltime cVar4;
  curltime now;
  curl_socket_t local_6c;
  curl_socket_t local_64;
  CURLcode local_4c;
  CURLcode result;
  Curl_easy *data;
  time_t timeout_ms;
  time_t interval_ms;
  int rc;
  curl_socket_t sock;
  connectdata *conn;
  _Bool block_local;
  pingpong *pp_local;
  
  conn_00 = pp->conn;
  local_6c = conn_00->sock[0];
  tVar3 = Curl_pp_state_timeout(pp);
  data_00 = conn_00->data;
  local_4c = CURLE_OK;
  if (tVar3 < 1) {
    Curl_failf(data_00,"server response timeout");
    pp_local._4_4_ = CURLE_OPERATION_TIMEDOUT;
  }
  else {
    if (block) {
      timeout_ms = 1000;
      if (tVar3 < 1000) {
        timeout_ms = tVar3;
      }
    }
    else {
      timeout_ms = 0;
    }
    _Var1 = Curl_ssl_data_pending(conn_00,0);
    if (_Var1) {
      interval_ms._0_4_ = 1;
    }
    else {
      _Var1 = Curl_pp_moredata(pp);
      if (_Var1) {
        interval_ms._0_4_ = 1;
      }
      else if ((pp->sendleft == 0) && (_Var1 = Curl_ssl_data_pending(conn_00,0), _Var1)) {
        interval_ms._0_4_ = 1;
      }
      else {
        local_64 = local_6c;
        if (pp->sendleft != 0) {
          local_64 = -1;
        }
        if (pp->sendleft == 0) {
          local_6c = -1;
        }
        interval_ms._0_4_ = Curl_socket_check(local_64,-1,local_6c,timeout_ms);
      }
    }
    if (block) {
      iVar2 = Curl_pgrsUpdate(conn_00);
      if (iVar2 == 0) {
        cVar4 = Curl_now();
        now._12_4_ = 0;
        now.tv_sec = SUB128(cVar4._0_12_,0);
        now.tv_usec = SUB124(cVar4._0_12_,8);
        local_4c = Curl_speedcheck(data_00,now);
      }
      else {
        local_4c = CURLE_ABORTED_BY_CALLBACK;
      }
      if (local_4c != CURLE_OK) {
        return local_4c;
      }
    }
    if ((int)interval_ms == -1) {
      Curl_failf(data_00,"select/poll error");
      local_4c = CURLE_OUT_OF_MEMORY;
    }
    else if ((int)interval_ms != 0) {
      local_4c = (*pp->statemach_act)(conn_00);
    }
    pp_local._4_4_ = local_4c;
  }
  return pp_local._4_4_;
}

Assistant:

CURLcode Curl_pp_statemach(struct pingpong *pp, bool block)
{
  struct connectdata *conn = pp->conn;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int rc;
  time_t interval_ms;
  time_t timeout_ms = Curl_pp_state_timeout(pp);
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;

  if(timeout_ms <= 0) {
    failf(data, "server response timeout");
    return CURLE_OPERATION_TIMEDOUT; /* already too little time */
  }

  if(block) {
    interval_ms = 1000;  /* use 1 second timeout intervals */
    if(timeout_ms < interval_ms)
      interval_ms = timeout_ms;
  }
  else
    interval_ms = 0; /* immediate */

  if(Curl_ssl_data_pending(conn, FIRSTSOCKET))
    rc = 1;
  else if(Curl_pp_moredata(pp))
    /* We are receiving and there is data in the cache so just read it */
    rc = 1;
  else if(!pp->sendleft && Curl_ssl_data_pending(conn, FIRSTSOCKET))
    /* We are receiving and there is data ready in the SSL library */
    rc = 1;
  else
    rc = Curl_socket_check(pp->sendleft?CURL_SOCKET_BAD:sock, /* reading */
                           CURL_SOCKET_BAD,
                           pp->sendleft?sock:CURL_SOCKET_BAD, /* writing */
                           interval_ms);

  if(block) {
    /* if we didn't wait, we don't have to spend time on this now */
    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_now());

    if(result)
      return result;
  }

  if(rc == -1) {
    failf(data, "select/poll error");
    result = CURLE_OUT_OF_MEMORY;
  }
  else if(rc)
    result = pp->statemach_act(conn);

  return result;
}